

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_GetTransactionByHandle_Test::TestBody
          (cfdcapi_transaction_GetTransactionByHandle_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char *pcVar5;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_41;
  AssertionResult gtest_ar_40;
  AssertionResult gtest_ar_39;
  AssertionResult gtest_ar_38;
  char *str_buffer;
  AssertionResult gtest_ar_37;
  AssertionResult gtest_ar_36;
  AssertionResult gtest_ar_35;
  AssertionResult gtest_ar_34;
  AssertionResult gtest_ar_33;
  AssertionResult gtest_ar_32;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  uint32_t index;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  uint32_t count;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  char *locking_script;
  int64_t value_satoshi;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  char *stack_data;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  uint32_t sequence;
  uint32_t vout;
  char *script_sig;
  char *txin_txid;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  uint32_t locktime;
  uint32_t version;
  uint32_t weight;
  uint32_t vsize;
  uint32_t size;
  char *wtxid;
  char *txid;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_2;
  void *tx_handle;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  void *err_handle;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffff3e8;
  type *ptVar6;
  char **direct_locking_script;
  AssertionResult *in_stack_fffffffffffff3f0;
  CfdErrorCode *in_stack_fffffffffffff3f8;
  char *in_stack_fffffffffffff400;
  void **in_stack_fffffffffffff408;
  void *in_stack_fffffffffffff428;
  AssertionResult *pAVar7;
  char **in_stack_fffffffffffff480;
  AssertionResult *in_stack_fffffffffffff488;
  undefined7 in_stack_fffffffffffff4a8;
  undefined1 in_stack_fffffffffffff4af;
  void *in_stack_fffffffffffff4b0;
  void *in_stack_fffffffffffff4b8;
  undefined7 in_stack_fffffffffffff4c0;
  char *in_stack_fffffffffffff4c8;
  AssertionResult *pAVar8;
  undefined4 in_stack_fffffffffffff584;
  uint32_t uVar9;
  char *in_stack_fffffffffffff588;
  undefined7 in_stack_fffffffffffff598;
  undefined7 in_stack_fffffffffffff5b0;
  undefined1 in_stack_fffffffffffff5b7;
  char *in_stack_fffffffffffff5b8;
  undefined8 in_stack_fffffffffffff5c0;
  undefined7 in_stack_fffffffffffff5c8;
  undefined1 in_stack_fffffffffffff5cf;
  uint32_t *in_stack_fffffffffffff680;
  undefined7 in_stack_fffffffffffff688;
  undefined1 in_stack_fffffffffffff68f;
  char **in_stack_fffffffffffff690;
  char **in_stack_fffffffffffff698;
  undefined7 in_stack_fffffffffffff6a0;
  undefined1 in_stack_fffffffffffff6a7;
  void *in_stack_fffffffffffff6a8;
  uint32_t *in_stack_fffffffffffff6c0;
  uint32_t *in_stack_fffffffffffff6c8;
  undefined7 in_stack_fffffffffffff6d0;
  undefined1 in_stack_fffffffffffff6d7;
  AssertionResult *this_00;
  uint32_t in_stack_fffffffffffff748;
  undefined4 in_stack_fffffffffffff74c;
  int iVar10;
  char *in_stack_fffffffffffff750;
  AssertionResult *this_01;
  char **in_stack_fffffffffffff780;
  AssertionResult *this_02;
  undefined7 in_stack_fffffffffffff790;
  undefined8 in_stack_fffffffffffff798;
  undefined7 in_stack_fffffffffffff7a8;
  uint32_t *in_stack_fffffffffffff810;
  undefined7 in_stack_fffffffffffff820;
  uint32_t in_stack_fffffffffffff82c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff830;
  undefined4 in_stack_fffffffffffff838;
  undefined4 in_stack_fffffffffffff83c;
  AssertionResult local_7c0;
  AssertHelper in_stack_fffffffffffff850;
  Message local_7a8;
  undefined4 local_79c;
  AssertionResult local_798;
  AssertHelper local_788;
  Message local_780;
  AssertionResult local_778;
  AssertHelper local_768;
  Message local_760;
  undefined4 local_754;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff8b8;
  undefined8 in_stack_fffffffffffff8c0;
  uint32_t stack_index;
  uint32_t in_stack_fffffffffffff8c8;
  int in_stack_fffffffffffff8cc;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8dc;
  AssertionResult local_720;
  AssertHelper local_710;
  Message local_708;
  undefined4 local_6fc;
  AssertionResult local_6f8;
  AssertHelper local_6e8;
  Message local_6e0;
  undefined4 local_6d4;
  AssertionResult local_6d0;
  AssertHelper local_6c0;
  Message local_6b8;
  undefined4 local_6ac;
  AssertionResult local_6a8;
  AssertHelper local_698;
  Message local_690;
  undefined4 local_684;
  AssertionResult local_680;
  AssertHelper local_670;
  Message local_668;
  undefined4 local_65c;
  AssertionResult local_658;
  AssertHelper local_648;
  Message local_640;
  undefined4 local_634;
  AssertionResult local_630;
  AssertHelper local_620;
  Message local_618;
  undefined4 local_60c;
  AssertionResult local_608;
  AssertHelper local_5f8;
  Message local_5f0;
  undefined4 local_5e4;
  AssertionResult local_5e0;
  AssertHelper local_5d0;
  Message local_5c8;
  undefined4 local_5bc;
  AssertionResult local_5b8;
  AssertHelper local_5a8;
  Message local_5a0;
  undefined4 local_594;
  AssertionResult local_590;
  undefined4 local_57c;
  AssertHelper local_578;
  Message local_570;
  undefined4 local_564;
  AssertionResult local_560;
  AssertHelper local_550;
  Message local_548;
  undefined4 local_53c;
  AssertionResult local_538;
  AssertHelper local_528;
  Message local_520;
  undefined4 local_514;
  AssertionResult local_510;
  AssertHelper local_500;
  Message local_4f8;
  undefined4 local_4ec;
  AssertionResult local_4e8;
  AssertHelper local_4d8;
  Message local_4d0;
  undefined4 local_4c4;
  AssertionResult local_4c0;
  AssertHelper local_4b0;
  Message local_4a8;
  undefined4 local_49c;
  AssertionResult local_498;
  undefined4 local_484;
  AssertHelper local_480;
  Message local_478;
  AssertionResult local_470;
  AssertHelper local_460;
  Message local_458;
  undefined4 local_44c;
  AssertionResult local_448;
  AssertHelper local_438;
  Message local_430;
  undefined4 local_424;
  AssertionResult local_420;
  char *local_410;
  undefined8 local_408;
  AssertHelper local_400;
  Message local_3f8;
  AssertionResult local_3f0;
  AssertHelper local_3e0;
  Message local_3d8;
  undefined4 local_3cc;
  AssertionResult local_3c8;
  char *local_3b8;
  AssertHelper local_3b0;
  Message local_3a8;
  AssertionResult local_3a0;
  AssertHelper local_390;
  Message local_388;
  undefined8 local_380;
  AssertionResult local_378;
  AssertHelper local_368;
  Message local_360;
  undefined4 local_354;
  AssertionResult local_350;
  AssertHelper local_340;
  Message local_338;
  AssertionResult local_330;
  AssertHelper local_320;
  Message local_318;
  undefined4 local_30c;
  AssertionResult local_308;
  undefined4 local_2f8;
  undefined4 local_2f4;
  char *local_2f0;
  char *local_2e8;
  AssertHelper local_2e0;
  Message local_2d8;
  AssertionResult local_2d0;
  AssertHelper local_2c0;
  Message local_2b8;
  AssertionResult local_2b0;
  AssertHelper local_2a0;
  Message local_298;
  undefined4 local_28c;
  AssertionResult local_288;
  AssertHelper local_278;
  Message local_270;
  undefined4 local_264;
  AssertionResult local_260;
  AssertHelper local_250;
  Message local_248;
  undefined4 local_23c;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220;
  undefined4 local_214;
  AssertionResult local_210;
  AssertHelper local_200;
  Message local_1f8;
  undefined4 local_1ec;
  AssertionResult local_1e8;
  AssertHelper local_1d8;
  Message local_1d0;
  undefined4 local_1c4;
  AssertionResult local_1c0;
  CfdErrorCode local_1ac;
  AssertionResult local_1a8;
  char *local_198;
  char *local_190;
  string local_188;
  AssertHelper local_168;
  Message local_160;
  undefined1 local_151;
  AssertionResult local_150;
  AssertHelper in_stack_fffffffffffffec0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 uVar11;
  uint32_t in_stack_fffffffffffffedc;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffee0;
  void *handle_00;
  string local_110;
  AssertHelper local_f0;
  Message local_e8;
  undefined1 local_d9;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  long local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  void *local_10;
  
  uVar9 = (uint32_t)((ulong)in_stack_fffffffffffff798 >> 0x20);
  stack_index = (uint32_t)((ulong)in_stack_fffffffffffff8c0 >> 0x20);
  iVar10 = (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20);
  local_10 = (void *)0x0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffff408);
  local_2c = 0;
  pAVar7 = &local_28;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8,
             (int *)in_stack_fffffffffffff3f0);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
  if (!(bool)uVar1) {
    testing::Message::Message(local_48);
    in_stack_fffffffffffff810 =
         (uint32_t *)testing::AssertionResult::failure_message((AssertionResult *)0x3bf0ba);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x20e,(char *)in_stack_fffffffffffff810);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3bf11d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bf172);
  local_61 = local_10 != (void *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,(type *)0x3bf1a6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x20f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3bf2a2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bf31d);
  local_a0 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffff408);
  local_b4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8,
             (int *)in_stack_fffffffffffff3f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar2) {
    testing::Message::Message(&local_c0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3bf3ea);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x213,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x3bf44d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bf4a2);
  local_d9 = local_a0 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,(type *)0x3bf4d6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
  if (!bVar2) {
    testing::Message::Message(&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)&local_d8,(AssertionResult *)"(NULL == err_handle)","true",
               "false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x214,pcVar5);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    testing::Message::~Message((Message *)0x3bf5d2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bf64d);
  handle_00 = (void *)0x0;
  local_14 = CfdInitializeTxDataHandle
                       ((void *)CONCAT17(in_stack_fffffffffffff5cf,in_stack_fffffffffffff5c8),iVar10
                        ,in_stack_fffffffffffff5b8,
                        (void **)CONCAT17(in_stack_fffffffffffff5b7,in_stack_fffffffffffff5b0));
  uVar11 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8,
             (int *)in_stack_fffffffffffff3f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffed8);
  if (!bVar2) {
    testing::Message::Message((Message *)&stack0xfffffffffffffec8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3bf72b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffec0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x218,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffec0,(Message *)&stack0xfffffffffffffec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffec0);
    testing::Message::~Message((Message *)0x3bf78e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bf7e3);
  local_151 = handle_00 != local_10;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,(type *)0x3bf81f);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_150);
  if (!bVar2) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_188,(internal *)&local_150,(AssertionResult *)"(tx_handle == handle)","true",
               "false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x219,pcVar5);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    testing::Message::~Message((Message *)0x3bf91b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bf996);
  if (local_14 == 0) {
    local_190 = (char *)0x0;
    local_198 = (char *)0x0;
    local_1a8.message_.ptr_._4_4_ = 0;
    local_1a8.message_.ptr_._0_4_ = 0;
    local_1a8._4_4_ = 0;
    local_1a8.success_ = false;
    local_1a8._1_3_ = 0;
    local_1ac = kCfdSuccess;
    in_stack_fffffffffffff3f8 = &local_1ac;
    in_stack_fffffffffffff3f0 = &local_1a8;
    ptVar6 = &local_1a8.field_0x4;
    local_14 = CfdGetTxInfoByHandle
                         (in_stack_fffffffffffff6a8,
                          (void *)CONCAT17(in_stack_fffffffffffff6a7,in_stack_fffffffffffff6a0),
                          in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                          (uint32_t *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
                          in_stack_fffffffffffff680,in_stack_fffffffffffff6c0,
                          in_stack_fffffffffffff6c8,
                          (uint32_t *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0))
    ;
    local_1c4 = 0;
    pAVar8 = &local_1c0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(int *)in_stack_fffffffffffff3f0);
    uVar3 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
    if (!(bool)uVar3) {
      testing::Message::Message(&local_1d0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3bfb02);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x225,pcVar5);
      uVar9 = (uint32_t)((ulong)pcVar5 >> 0x20);
      testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1d8);
      testing::Message::~Message((Message *)0x3bfb65);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bfbba);
    local_1ec = 800;
    this_02 = &local_1e8;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(uint *)in_stack_fffffffffffff3f0);
    uVar4 = testing::AssertionResult::operator_cast_to_bool(this_02);
    if (!(bool)uVar4) {
      testing::Message::Message(&local_1f8);
      in_stack_fffffffffffff780 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3bfc67);
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x226,(char *)in_stack_fffffffffffff780);
      testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      testing::Message::~Message((Message *)0x3bfcca);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bfd1f);
    local_214 = 0x13c;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(uint *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_210);
    if (!bVar2) {
      testing::Message::Message(&local_220);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3bfdcc);
      testing::internal::AssertHelper::AssertHelper
                (&local_228,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x227,pcVar5);
      testing::internal::AssertHelper::operator=(&local_228,&local_220);
      testing::internal::AssertHelper::~AssertHelper(&local_228);
      testing::Message::~Message((Message *)0x3bfe2f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bfe84);
    local_23c = 0x4ee;
    this_01 = &local_238;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(uint *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
    if (!bVar2) {
      testing::Message::Message(&local_248);
      in_stack_fffffffffffff750 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3bff31);
      testing::internal::AssertHelper::AssertHelper
                (&local_250,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x228,in_stack_fffffffffffff750);
      testing::internal::AssertHelper::operator=(&local_250,&local_248);
      testing::internal::AssertHelper::~AssertHelper(&local_250);
      testing::Message::~Message((Message *)0x3bff94);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bffe9);
    local_264 = 1;
    this_00 = &local_260;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(uint *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(this_00);
    iVar10 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff74c);
    if (!bVar2) {
      testing::Message::Message(&local_270);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c0096);
      testing::internal::AssertHelper::AssertHelper
                (&local_278,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x229,pcVar5);
      testing::internal::AssertHelper::operator=(&local_278,&local_270);
      testing::internal::AssertHelper::~AssertHelper(&local_278);
      testing::Message::~Message((Message *)0x3c00f9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c014e);
    local_28c = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(uint *)in_stack_fffffffffffff3f0,ptVar6);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_288);
    if (!bVar2) {
      testing::Message::Message(&local_298);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c0200);
      testing::internal::AssertHelper::AssertHelper
                (&local_2a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x22a,pcVar5);
      testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
      testing::internal::AssertHelper::~AssertHelper(&local_2a0);
      testing::Message::~Message((Message *)0x3c0263);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c02b8);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_2b0,
                 "\"27eae69aff1dd4388c0fa05cbbfe9a3983d1b0b5811ebcd4199b86f299370aac\"","txid",
                 "27eae69aff1dd4388c0fa05cbbfe9a3983d1b0b5811ebcd4199b86f299370aac",local_190);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
      if (!bVar2) {
        testing::Message::Message(&local_2b8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c0367);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x22c,pcVar5);
        testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
        testing::internal::AssertHelper::~AssertHelper(&local_2c0);
        testing::Message::~Message((Message *)0x3c03ca);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c041f);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_2d0,
                 "\"65dab5dd46a501fc695822c73d779067f2feb7c49dc47d39f86fdb2e3960b3bd\"","wtxid",
                 "65dab5dd46a501fc695822c73d779067f2feb7c49dc47d39f86fdb2e3960b3bd",local_198);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2d0);
      if (!bVar2) {
        testing::Message::Message(&local_2d8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c04c0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x22d,pcVar5);
        testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
        testing::internal::AssertHelper::~AssertHelper(&local_2e0);
        testing::Message::~Message((Message *)0x3c0523);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c0578);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff3f8);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff3f8);
    }
    local_2e8 = (char *)0x0;
    local_2f0 = (char *)0x0;
    local_2f4 = 0;
    local_2f8 = 0;
    direct_locking_script = &local_2f0;
    local_14 = CfdGetTxInByHandle((void *)CONCAT44(in_stack_fffffffffffff83c,
                                                   in_stack_fffffffffffff838),
                                  in_stack_fffffffffffff830.ptr_,in_stack_fffffffffffff82c,
                                  (char **)CONCAT17(uVar1,in_stack_fffffffffffff820),
                                  (uint32_t *)pAVar7,in_stack_fffffffffffff810,
                                  (char **)in_stack_fffffffffffff850.data_);
    local_30c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(int *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_308);
    if (!bVar2) {
      testing::Message::Message(&local_318);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c06b3);
      testing::internal::AssertHelper::AssertHelper
                (&local_320,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x239,pcVar5);
      testing::internal::AssertHelper::operator=(&local_320,&local_318);
      testing::internal::AssertHelper::~AssertHelper(&local_320);
      testing::Message::~Message((Message *)0x3c0716);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c076b);
    if (local_14 == 0) {
      pAVar7 = &local_330;
      testing::internal::CmpHelperSTREQ
                ((internal *)pAVar7,
                 "\"6eb98797a21c6c10aa74edf29d618be109f48a8e94c694f3701e08ca69186436\"","txin_txid",
                 "6eb98797a21c6c10aa74edf29d618be109f48a8e94c694f3701e08ca69186436",local_2e8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
      if (!bVar2) {
        testing::Message::Message(&local_338);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c081a);
        testing::internal::AssertHelper::AssertHelper
                  (&local_340,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x23b,pcVar5);
        testing::internal::AssertHelper::operator=(&local_340,&local_338);
        testing::internal::AssertHelper::~AssertHelper(&local_340);
        testing::Message::~Message((Message *)0x3c087d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c08d2);
      local_354 = 1;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,
                 in_stack_fffffffffffff3f8,(uint *)in_stack_fffffffffffff3f0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_350);
      if (!bVar2) {
        testing::Message::Message(&local_360);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c097f);
        testing::internal::AssertHelper::AssertHelper
                  (&local_368,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x23c,pcVar5);
        testing::internal::AssertHelper::operator=(&local_368,&local_360);
        testing::internal::AssertHelper::~AssertHelper(&local_368);
        testing::Message::~Message((Message *)0x3c09e2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c0a37);
      local_380 = 0xffffffff;
      pAVar7 = &local_378;
      testing::internal::EqHelper<false>::Compare<long,unsigned_int>
                ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,
                 (long *)in_stack_fffffffffffff3f8,(uint *)in_stack_fffffffffffff3f0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
      if (!bVar2) {
        testing::Message::Message(&local_388);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c0ae6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_390,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x23d,pcVar5);
        testing::internal::AssertHelper::operator=(&local_390,&local_388);
        testing::internal::AssertHelper::~AssertHelper(&local_390);
        testing::Message::~Message((Message *)0x3c0b49);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c0b9e);
      pAVar7 = &local_3a0;
      testing::internal::CmpHelperSTREQ
                ((internal *)pAVar7,
                 "\"220020a16b5755f7f6f96dbd65f5f0d6ab9418b89af4b1f14a1bb8a09062c35f0dcb54\"",
                 "script_sig",
                 "220020a16b5755f7f6f96dbd65f5f0d6ab9418b89af4b1f14a1bb8a09062c35f0dcb54",local_2f0)
      ;
      bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
      if (!bVar2) {
        testing::Message::Message(&local_3a8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c0c3f);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x23e,pcVar5);
        testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
        testing::internal::AssertHelper::~AssertHelper(&local_3b0);
        testing::Message::~Message((Message *)0x3c0ca2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c0cf7);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff3f8);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff3f8);
    }
    local_3b8 = (char *)0x0;
    local_14 = CfdGetTxInWitnessByHandle
                         ((void *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                          in_stack_fffffffffffff8d0.ptr_,in_stack_fffffffffffff8cc,
                          in_stack_fffffffffffff8c8,stack_index,
                          (char **)in_stack_fffffffffffff8b8.ptr_);
    local_3cc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(int *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3c8);
    if (!bVar2) {
      testing::Message::Message(&local_3d8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c0dfa);
      testing::internal::AssertHelper::AssertHelper
                (&local_3e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x246,pcVar5);
      testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
      testing::internal::AssertHelper::~AssertHelper(&local_3e0);
      testing::Message::~Message((Message *)0x3c0e5d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c0eb2);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_3f0,
                 "\"56210307b8ae49ac90a048e9b53357a2354b3334e9c8bee813ecb98e99a7e07e8c3ba32103b28f0c28bfab54554ae8c658ac5c3e0ce6e79ad336331f78c428dd43eea8449b21034b8113d703413d57761b8b9781957b8c0ac1dfe69f492580ca4195f50376ba4a21033400f6afecb833092a9a21cfdf1ed1376e58c5d1f47de74683123987e967a8f42103a6d48b1131e94ba04d9737d61acdaa1322008af9602b3b14862c07a1789aac162102d8b661b0b3302ee2f162b09e07a55ad5dfbe673a9f01d9f0c19617681024306b56ae\""
                 ,"stack_data",
                 "56210307b8ae49ac90a048e9b53357a2354b3334e9c8bee813ecb98e99a7e07e8c3ba32103b28f0c28bfab54554ae8c658ac5c3e0ce6e79ad336331f78c428dd43eea8449b21034b8113d703413d57761b8b9781957b8c0ac1dfe69f492580ca4195f50376ba4a21033400f6afecb833092a9a21cfdf1ed1376e58c5d1f47de74683123987e967a8f42103a6d48b1131e94ba04d9737d61acdaa1322008af9602b3b14862c07a1789aac162102d8b661b0b3302ee2f162b09e07a55ad5dfbe673a9f01d9f0c19617681024306b56ae"
                 ,local_3b8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3f0);
      if (!bVar2) {
        testing::Message::Message(&local_3f8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c0f61);
        testing::internal::AssertHelper::AssertHelper
                  (&local_400,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x248,pcVar5);
        testing::internal::AssertHelper::operator=(&local_400,&local_3f8);
        testing::internal::AssertHelper::~AssertHelper(&local_400);
        testing::Message::~Message((Message *)0x3c0fc4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c1019);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff3f8);
    }
    local_408 = 0;
    local_410 = (char *)0x0;
    local_14 = CfdGetTxOutByHandle((void *)CONCAT17(uVar3,in_stack_fffffffffffff7a8),pAVar8,uVar9,
                                   (int64_t *)CONCAT17(uVar4,in_stack_fffffffffffff790),
                                   (char **)this_02,in_stack_fffffffffffff780);
    local_424 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(int *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_420);
    if (!bVar2) {
      testing::Message::Message(&local_430);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c1123);
      testing::internal::AssertHelper::AssertHelper
                (&local_438,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x250,pcVar5);
      testing::internal::AssertHelper::operator=(&local_438,&local_430);
      testing::internal::AssertHelper::~AssertHelper(&local_438);
      testing::Message::~Message((Message *)0x3c1186);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c11de);
    if (local_14 == 0) {
      local_44c = 87000000;
      testing::internal::EqHelper<false>::Compare<int,long>
                ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,
                 in_stack_fffffffffffff3f8,(long *)in_stack_fffffffffffff3f0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_448);
      if (!bVar2) {
        testing::Message::Message(&local_458);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c1299);
        testing::internal::AssertHelper::AssertHelper
                  (&local_460,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x252,pcVar5);
        testing::internal::AssertHelper::operator=(&local_460,&local_458);
        testing::internal::AssertHelper::~AssertHelper(&local_460);
        testing::Message::~Message((Message *)0x3c12fc);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c1351);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_470,"\"76a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac\"",
                 "locking_script","76a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac",local_410);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_470);
      if (!bVar2) {
        testing::Message::Message(&local_478);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c13f2);
        testing::internal::AssertHelper::AssertHelper
                  (&local_480,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x253,pcVar5);
        testing::internal::AssertHelper::operator=(&local_480,&local_478);
        testing::internal::AssertHelper::~AssertHelper(&local_480);
        testing::Message::~Message((Message *)0x3c1455);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c14aa);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff3f8);
    }
    local_484 = 0;
    local_14 = CfdGetTxInCountByHandle
                         (in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0,
                          (uint32_t *)CONCAT17(in_stack_fffffffffffff4af,in_stack_fffffffffffff4a8))
    ;
    local_49c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(int *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_498);
    if (!bVar2) {
      testing::Message::Message(&local_4a8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c1595);
      testing::internal::AssertHelper::AssertHelper
                (&local_4b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x25a,pcVar5);
      testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
      testing::internal::AssertHelper::~AssertHelper(&local_4b0);
      testing::Message::~Message((Message *)0x3c15f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c164d);
    local_4c4 = 1;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(uint *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4c0);
    if (!bVar2) {
      testing::Message::Message(&local_4d0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c16fa);
      testing::internal::AssertHelper::AssertHelper
                (&local_4d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x25b,pcVar5);
      testing::internal::AssertHelper::operator=(&local_4d8,&local_4d0);
      testing::internal::AssertHelper::~AssertHelper(&local_4d8);
      testing::Message::~Message((Message *)0x3c175d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c17b5);
    local_14 = CfdGetTxInWitnessCountByHandle
                         (this_01,in_stack_fffffffffffff750,iVar10,in_stack_fffffffffffff748,
                          (uint32_t *)this_00);
    local_4ec = 0;
    pAVar7 = &local_4e8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(int *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
    if (!bVar2) {
      testing::Message::Message(&local_4f8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c188a);
      testing::internal::AssertHelper::AssertHelper
                (&local_500,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x25f,pcVar5);
      testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
      testing::internal::AssertHelper::~AssertHelper(&local_500);
      testing::Message::~Message((Message *)0x3c18ed);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c1942);
    local_514 = 8;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(uint *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_510);
    if (!bVar2) {
      testing::Message::Message(&local_520);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c19ef);
      testing::internal::AssertHelper::AssertHelper
                (&local_528,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x260,pcVar5);
      testing::internal::AssertHelper::operator=(&local_528,&local_520);
      testing::internal::AssertHelper::~AssertHelper(&local_528);
      testing::Message::~Message((Message *)0x3c1a52);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c1aaa);
    local_14 = CfdGetTxOutCountByHandle
                         (in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0,
                          (uint32_t *)CONCAT17(in_stack_fffffffffffff4af,in_stack_fffffffffffff4a8))
    ;
    local_53c = 0;
    pAVar7 = &local_538;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(int *)in_stack_fffffffffffff3f0);
    uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
    if (!(bool)uVar1) {
      testing::Message::Message(&local_548);
      in_stack_fffffffffffff588 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3c1b7b);
      testing::internal::AssertHelper::AssertHelper
                (&local_550,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x264,in_stack_fffffffffffff588);
      testing::internal::AssertHelper::operator=(&local_550,&local_548);
      testing::internal::AssertHelper::~AssertHelper(&local_550);
      testing::Message::~Message((Message *)0x3c1bde);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c1c33);
    local_564 = 2;
    pAVar8 = &local_560;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(uint *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar8);
    uVar9 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff584);
    if (!bVar2) {
      testing::Message::Message(&local_570);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c1ce0);
      testing::internal::AssertHelper::AssertHelper
                (&local_578,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x265,pcVar5);
      testing::internal::AssertHelper::operator=(&local_578,&local_570);
      testing::internal::AssertHelper::~AssertHelper(&local_578);
      testing::Message::~Message((Message *)0x3c1d43);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c1d9b);
    local_57c = 0;
    local_14 = CfdGetTxInIndexByHandle
                         ((void *)CONCAT17(uVar1,in_stack_fffffffffffff598),pAVar7,
                          in_stack_fffffffffffff588,uVar9,(uint32_t *)pAVar8);
    local_594 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(int *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_590);
    if (!bVar2) {
      testing::Message::Message(&local_5a0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c1e83);
      testing::internal::AssertHelper::AssertHelper
                (&local_5a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x26b,pcVar5);
      testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
      testing::internal::AssertHelper::~AssertHelper(&local_5a8);
      testing::Message::~Message((Message *)0x3c1ee6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c1f3b);
    local_5bc = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(uint *)in_stack_fffffffffffff3f0,direct_locking_script);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_5b8);
    if (!bVar2) {
      testing::Message::Message(&local_5c8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c1fed);
      testing::internal::AssertHelper::AssertHelper
                (&local_5d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x26c,pcVar5);
      testing::internal::AssertHelper::operator=(&local_5d0,&local_5c8);
      testing::internal::AssertHelper::~AssertHelper(&local_5d0);
      testing::Message::~Message((Message *)0x3c2050);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c20a8);
    local_14 = CfdGetTxOutIndexByHandle
                         (in_stack_fffffffffffff400,in_stack_fffffffffffff3f8,
                          &in_stack_fffffffffffff3f0->success_,(char *)direct_locking_script,
                          (uint32_t *)0x3c20d3);
    local_5e4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(int *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_5e0);
    if (!bVar2) {
      testing::Message::Message(&local_5f0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c2187);
      testing::internal::AssertHelper::AssertHelper
                (&local_5f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x270,pcVar5);
      testing::internal::AssertHelper::operator=(&local_5f8,&local_5f0);
      testing::internal::AssertHelper::~AssertHelper(&local_5f8);
      testing::Message::~Message((Message *)0x3c21ea);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c223f);
    local_60c = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(uint *)in_stack_fffffffffffff3f0,direct_locking_script);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_608);
    if (!bVar2) {
      testing::Message::Message(&local_618);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c22f1);
      testing::internal::AssertHelper::AssertHelper
                (&local_620,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x271,pcVar5);
      testing::internal::AssertHelper::operator=(&local_620,&local_618);
      testing::internal::AssertHelper::~AssertHelper(&local_620);
      testing::Message::~Message((Message *)0x3c2354);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c23ac);
    local_14 = CfdGetTxOutIndexWithOffsetByHandle
                         (handle_00,in_stack_fffffffffffffee0.ptr_,in_stack_fffffffffffffedc,
                          (char *)CONCAT44(uVar11,in_stack_fffffffffffffed0),
                          (char *)in_stack_fffffffffffffec8.ptr_,
                          &(in_stack_fffffffffffffec0.data_)->type);
    local_634 = 3;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(int *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_630);
    if (!bVar2) {
      testing::Message::Message(&local_640);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c2490);
      testing::internal::AssertHelper::AssertHelper
                (&local_648,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x275,pcVar5);
      testing::internal::AssertHelper::operator=(&local_648,&local_640);
      testing::internal::AssertHelper::~AssertHelper(&local_648);
      testing::Message::~Message((Message *)0x3c24f3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c2548);
    local_65c = 0;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(uint *)in_stack_fffffffffffff3f0,direct_locking_script);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_658);
    if (!bVar2) {
      testing::Message::Message(&local_668);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c25fa);
      testing::internal::AssertHelper::AssertHelper
                (&local_670,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x276,pcVar5);
      testing::internal::AssertHelper::operator=(&local_670,&local_668);
      testing::internal::AssertHelper::~AssertHelper(&local_670);
      testing::Message::~Message((Message *)0x3c265d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c26b5);
    local_14 = CfdGetTxOutIndexByHandle
                         (in_stack_fffffffffffff400,in_stack_fffffffffffff3f8,
                          &in_stack_fffffffffffff3f0->success_,(char *)direct_locking_script,
                          (uint32_t *)0x3c26e0);
    local_684 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(int *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_680);
    if (!bVar2) {
      testing::Message::Message(&local_690);
      in_stack_fffffffffffff4c8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3c2794);
      testing::internal::AssertHelper::AssertHelper
                (&local_698,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x27a,in_stack_fffffffffffff4c8);
      testing::internal::AssertHelper::operator=(&local_698,&local_690);
      testing::internal::AssertHelper::~AssertHelper(&local_698);
      testing::Message::~Message((Message *)0x3c27f7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c284c);
    local_6ac = 1;
    pAVar7 = &local_6a8;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(uint *)in_stack_fffffffffffff3f0);
    uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
    if (!(bool)uVar1) {
      testing::Message::Message(&local_6b8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c28f9);
      testing::internal::AssertHelper::AssertHelper
                (&local_6c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x27b,pcVar5);
      testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
      testing::internal::AssertHelper::~AssertHelper(&local_6c0);
      testing::Message::~Message((Message *)0x3c295c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c29b4);
    local_14 = CfdGetTxOutIndexWithOffsetByHandle
                         (handle_00,in_stack_fffffffffffffee0.ptr_,in_stack_fffffffffffffedc,
                          (char *)CONCAT44(uVar11,in_stack_fffffffffffffed0),
                          (char *)in_stack_fffffffffffffec8.ptr_,
                          &(in_stack_fffffffffffffec0.data_)->type);
    local_6d4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(int *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_6d0);
    if (!bVar2) {
      testing::Message::Message(&local_6e0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c2a98);
      testing::internal::AssertHelper::AssertHelper
                (&local_6e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x27f,pcVar5);
      testing::internal::AssertHelper::operator=(&local_6e8,&local_6e0);
      testing::internal::AssertHelper::~AssertHelper(&local_6e8);
      testing::Message::~Message((Message *)0x3c2afb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c2b50);
    local_6fc = 1;
    in_stack_fffffffffffff488 = &local_6f8;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(uint *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff488);
    if (!bVar2) {
      testing::Message::Message(&local_708);
      in_stack_fffffffffffff480 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3c2bfd);
      testing::internal::AssertHelper::AssertHelper
                (&local_710,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x280,(char *)in_stack_fffffffffffff480);
      testing::internal::AssertHelper::operator=(&local_710,&local_708);
      testing::internal::AssertHelper::~AssertHelper(&local_710);
      testing::Message::~Message((Message *)0x3c2c60);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c2cb8);
    local_14 = CfdFreeTxDataHandle(in_stack_fffffffffffff4c8,
                                   (void *)CONCAT17(uVar1,in_stack_fffffffffffff4c0));
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(int *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_720);
    if (!bVar2) {
      testing::Message::Message((Message *)&stack0xfffffffffffff8d0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c2d81);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffff8c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x283,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffff8c8,(Message *)&stack0xfffffffffffff8d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff8c8);
      testing::Message::~Message((Message *)0x3c2de4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c2e39);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffff428);
  if (local_14 != 0) {
    pcVar5 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(in_stack_fffffffffffff488,in_stack_fffffffffffff480);
    local_754 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8
               ,(int *)in_stack_fffffffffffff3f0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffff8b0);
    if (!bVar2) {
      testing::Message::Message(&local_760);
      message = testing::AssertionResult::failure_message((AssertionResult *)0x3c2f26);
      testing::internal::AssertHelper::AssertHelper
                (&local_768,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x28a,message);
      testing::internal::AssertHelper::operator=(&local_768,&local_760);
      testing::internal::AssertHelper::~AssertHelper(&local_768);
      testing::Message::~Message((Message *)0x3c2f83);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c2fd8);
    testing::internal::CmpHelperSTREQ((internal *)&local_778,"\"\"","str_buffer","",pcVar5);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_778);
    if (!bVar2) {
      testing::Message::Message(&local_780);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c306d);
      testing::internal::AssertHelper::AssertHelper
                (&local_788,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x28b,pcVar5);
      testing::internal::AssertHelper::operator=(&local_788,&local_780);
      testing::internal::AssertHelper::~AssertHelper(&local_788);
      testing::Message::~Message((Message *)0x3c30ca);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c311f);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff3f8);
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffff3f8);
  local_79c = 0;
  pAVar7 = &local_798;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8,
             (int *)in_stack_fffffffffffff3f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
  if (!bVar2) {
    testing::Message::Message(&local_7a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c31ef);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffff850,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x291,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffff850,&local_7a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff850);
    testing::Message::~Message((Message *)0x3c324c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c32a1);
  local_14 = CfdFreeHandle(in_stack_fffffffffffff3f8);
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff408,in_stack_fffffffffffff400,in_stack_fffffffffffff3f8,
             (int *)in_stack_fffffffffffff3f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_7c0);
  if (!bVar2) {
    testing::Message::Message((Message *)&stack0xfffffffffffff830);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3c3356);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffff828,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x293,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffff828,(Message *)&stack0xfffffffffffff830);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff828);
    testing::Message::~Message((Message *)0x3c33b3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c3408);
  return;
}

Assistant:

TEST(cfdcapi_transaction, GetTransactionByHandle) {
  static const char* exp_tx = "0100000000010136641869ca081e70f394c6948e8af409e18b619df2ed74aa106c1ca29787b96e0100000023220020a16b5755f7f6f96dbd65f5f0d6ab9418b89af4b1f14a1bb8a09062c35f0dcb54ffffffff0200e9a435000000001976a914389ffce9cd9ae88dcc0631e88a821ffdbe9bfe2688acc0832f05000000001976a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac080047304402206ac44d672dac41f9b00e28f4df20c52eeb087207e8d758d76d92c6fab3b73e2b0220367750dbbe19290069cba53d096f44530e4f98acaa594810388cf7409a1870ce01473044022068c7946a43232757cbdf9176f009a928e1cd9a1a8c212f15c1e11ac9f2925d9002205b75f937ff2f9f3c1246e547e54f62e027f64eefa2695578cc6432cdabce271502473044022059ebf56d98010a932cf8ecfec54c48e6139ed6adb0728c09cbe1e4fa0915302e022007cd986c8fa870ff5d2b3a89139c9fe7e499259875357e20fcbb15571c76795403483045022100fbefd94bd0a488d50b79102b5dad4ab6ced30c4069f1eaa69a4b5a763414067e02203156c6a5c9cf88f91265f5a942e96213afae16d83321c8b31bb342142a14d16381483045022100a5263ea0553ba89221984bd7f0b13613db16e7a70c549a86de0cc0444141a407022005c360ef0ae5a5d4f9f2f87a56c1546cc8268cab08c73501d6b3be2e1e1a8a08824730440220525406a1482936d5a21888260dc165497a90a15669636d8edca6b9fe490d309c022032af0c646a34a44d1f4576bf6a4a74b67940f8faa84c7df9abe12a01a11e2b4783cf56210307b8ae49ac90a048e9b53357a2354b3334e9c8bee813ecb98e99a7e07e8c3ba32103b28f0c28bfab54554ae8c658ac5c3e0ce6e79ad336331f78c428dd43eea8449b21034b8113d703413d57761b8b9781957b8c0ac1dfe69f492580ca4195f50376ba4a21033400f6afecb833092a9a21cfdf1ed1376e58c5d1f47de74683123987e967a8f42103a6d48b1131e94ba04d9737d61acdaa1322008af9602b3b14862c07a1789aac162102d8b661b0b3302ee2f162b09e07a55ad5dfbe673a9f01d9f0c19617681024306b56ae00000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* err_handle = NULL;
  ret = CfdCreateHandle(&err_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == err_handle));

  void* tx_handle = NULL;
  ret = CfdInitializeTxDataHandle(handle, kCfdNetworkMainnet, exp_tx, &tx_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((tx_handle == handle));
  if (ret == kCfdSuccess) {
    char* txid = nullptr;
    char* wtxid = nullptr;
    uint32_t size = 0;
    uint32_t vsize = 0;
    uint32_t weight = 0;
    uint32_t version = 0;
    uint32_t locktime = 0;
    ret = CfdGetTxInfoByHandle(
        handle, tx_handle, &txid, &wtxid, &size, &vsize,
        &weight, &version, &locktime);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(800, size);
    EXPECT_EQ(316, vsize);
    EXPECT_EQ(1262, weight);
    EXPECT_EQ(1, version);
    EXPECT_EQ(0, locktime);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("27eae69aff1dd4388c0fa05cbbfe9a3983d1b0b5811ebcd4199b86f299370aac", txid);
      EXPECT_STREQ("65dab5dd46a501fc695822c73d779067f2feb7c49dc47d39f86fdb2e3960b3bd", wtxid);
      CfdFreeStringBuffer(txid);
      CfdFreeStringBuffer(wtxid);
    }

    char* txin_txid = nullptr;
    char* script_sig = nullptr;
    uint32_t vout = 0;
    uint32_t sequence = 0;
    ret = CfdGetTxInByHandle(
        handle, tx_handle, 0,
        &txin_txid, &vout, &sequence, &script_sig);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("6eb98797a21c6c10aa74edf29d618be109f48a8e94c694f3701e08ca69186436", txin_txid);
      EXPECT_EQ(1, vout);
      EXPECT_EQ(4294967295, sequence);
      EXPECT_STREQ("220020a16b5755f7f6f96dbd65f5f0d6ab9418b89af4b1f14a1bb8a09062c35f0dcb54", script_sig);
      CfdFreeStringBuffer(txin_txid);
      CfdFreeStringBuffer(script_sig);
    }

    char* stack_data = nullptr;
    ret = CfdGetTxInWitnessByHandle(
        handle, tx_handle, kCfdTxWitnessStackNormal, 0, 7, &stack_data);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("56210307b8ae49ac90a048e9b53357a2354b3334e9c8bee813ecb98e99a7e07e8c3ba32103b28f0c28bfab54554ae8c658ac5c3e0ce6e79ad336331f78c428dd43eea8449b21034b8113d703413d57761b8b9781957b8c0ac1dfe69f492580ca4195f50376ba4a21033400f6afecb833092a9a21cfdf1ed1376e58c5d1f47de74683123987e967a8f42103a6d48b1131e94ba04d9737d61acdaa1322008af9602b3b14862c07a1789aac162102d8b661b0b3302ee2f162b09e07a55ad5dfbe673a9f01d9f0c19617681024306b56ae", stack_data);
      CfdFreeStringBuffer(stack_data);
    }

    int64_t value_satoshi = 0;
    char* locking_script = nullptr;
    ret = CfdGetTxOutByHandle(
        handle, tx_handle, 1, &value_satoshi, &locking_script, NULL);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(87000000, value_satoshi);
      EXPECT_STREQ("76a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac", locking_script);
      CfdFreeStringBuffer(locking_script);
    }

    uint32_t count = 0;
    ret = CfdGetTxInCountByHandle(
        handle, tx_handle, &count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, count);

    ret = CfdGetTxInWitnessCountByHandle(
        handle, tx_handle, kCfdTxWitnessStackNormal, 0, &count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(8, count);

    ret = CfdGetTxOutCountByHandle(
        handle, tx_handle, &count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(2, count);

    uint32_t index = 0;
    ret = CfdGetTxInIndexByHandle(
        handle, tx_handle,
        "6eb98797a21c6c10aa74edf29d618be109f48a8e94c694f3701e08ca69186436", 1, &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(0, index);

    ret = CfdGetTxOutIndexByHandle(
        handle, tx_handle, "16AQVuBMt818u2HBcbxztAZTT2VTDKupPS", "", &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(0, index);

    ret = CfdGetTxOutIndexWithOffsetByHandle(
        err_handle, tx_handle, 1, "16AQVuBMt818u2HBcbxztAZTT2VTDKupPS", "", &index);
    EXPECT_EQ(kCfdOutOfRangeError, ret);
    EXPECT_EQ(0, index);

    ret = CfdGetTxOutIndexByHandle(
        handle, tx_handle, "", "76a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac", &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, index);

    ret = CfdGetTxOutIndexWithOffsetByHandle(
        handle, tx_handle, 1, "", "76a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac", &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, index);

    ret = CfdFreeTxDataHandle(handle, tx_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
  ret = CfdFreeHandle(err_handle);
  EXPECT_EQ(kCfdSuccess, ret);
}